

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O0

long yytnamerr(char *yyres,char *yystr)

{
  char cVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  char *yyp;
  long yyn;
  char *local_28;
  size_t local_20;
  size_t local_8;
  
  if (*in_RSI == '\"') {
    local_20 = 0;
    local_28 = in_RSI;
    while( true ) {
      cVar1 = local_28[1];
      if (cVar1 == '\"') break;
      if (((cVar1 == '\'') || (cVar1 == ',')) ||
         ((pcVar2 = local_28 + 1, cVar1 == '\\' && (pcVar2 = local_28 + 2, local_28[2] != '\\'))))
      goto LAB_0013cff9;
      local_28 = pcVar2;
      if (in_RDI != (char *)0x0) {
        in_RDI[local_20] = *local_28;
      }
      local_20 = local_20 + 1;
    }
    if (in_RDI != (char *)0x0) {
      in_RDI[local_20] = '\0';
    }
    local_8 = local_20;
  }
  else {
LAB_0013cff9:
    if (in_RDI == (char *)0x0) {
      local_8 = strlen(in_RSI);
    }
    else {
      pcVar2 = stpcpy(in_RDI,in_RSI);
      local_8 = (long)pcVar2 - (long)in_RDI;
    }
  }
  return local_8;
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}